

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

bool doctest::detail::binary_assert<0,std::__cxx11::string,char[18]>
               (Enum at,char *file,int line,char *expr,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
               char (*rhs) [18])

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  undefined1 uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar7;
  ResultBuilder rb;
  anon_union_24_2_13149d16_for_String_3 local_e0;
  char (*local_c8) [18];
  ResultBuilder local_c0;
  
  local_c8 = rhs;
  iVar5 = std::__cxx11::string::compare((char *)lhs);
  local_c0.super_AssertData.m_failed = iVar5 != 0;
  if (is_running_in_test == '\0') {
    if (iVar5 == 0) goto LAB_00137778;
    String::allocate((String *)&local_e0.data,0);
    ResultBuilder::ResultBuilder(&local_c0,at,file,line,expr,"",(String *)&local_e0.data);
    if ((local_e0.buf[0x17] < '\0') &&
       ((void *)CONCAT44(local_e0._4_4_,local_e0._0_4_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT44(local_e0._4_4_,local_e0._0_4_));
    }
    stringifyBinaryExpr<std::__cxx11::string,char[18]>
              ((String *)&local_e0.data,(detail *)lhs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1449c3,
               *local_c8,(char (*) [18])expr);
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT44(local_c0.super_AssertData.m_decomp.field_0._4_4_,
                         local_c0.super_AssertData.m_decomp.field_0._0_4_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT44(local_c0.super_AssertData.m_decomp.field_0._4_4_,
                                         local_c0.super_AssertData.m_decomp.field_0._0_4_));
    }
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = local_e0.buf[0x17];
    local_c0.super_AssertData.m_decomp.field_0._0_4_ = local_e0._0_4_;
    local_c0.super_AssertData.m_decomp.field_0._4_4_ = local_e0._4_4_;
    local_c0.super_AssertData.m_decomp.field_0.data.size = local_e0.data.size;
    local_c0.super_AssertData.m_decomp.field_0.data.capacity = local_e0.data.capacity;
    if (*(code **)(g_cs + 0x10e8) == (code *)0x0) {
      abort();
    }
    (**(code **)(g_cs + 0x10e8))(&local_c0);
    bVar4 = isDebuggerActive();
    if ((bVar4) && (*(char *)(g_cs + 0x79) == '\0')) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return (bool)uVar3;
    }
    bVar4 = checkIfShouldThrow(at);
    if (bVar4) {
      throwException();
    }
  }
  else {
    String::allocate((String *)&local_e0.data,0);
    ResultBuilder::ResultBuilder(&local_c0,at,file,line,expr,"",(String *)&local_e0.data);
    uVar6 = extraout_XMM0_Da;
    uVar7 = extraout_XMM0_Db;
    if ((local_e0.buf[0x17] < '\0') &&
       ((void *)CONCAT44(local_e0._4_4_,local_e0._0_4_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT44(local_e0._4_4_,local_e0._0_4_));
      uVar6 = extraout_XMM0_Da_00;
      uVar7 = extraout_XMM0_Db_00;
    }
    if ((iVar5 != 0) || (*(char *)(g_cs + 0x6c) == '\x01')) {
      stringifyBinaryExpr<std::__cxx11::string,char[18]>
                ((String *)&local_e0.data,(detail *)lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1449c3,
                 *local_c8,(char (*) [18])expr);
      if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT44(local_c0.super_AssertData.m_decomp.field_0._4_4_,
                           local_c0.super_AssertData.m_decomp.field_0._0_4_) != (void *)0x0)) {
        operator_delete__((void *)CONCAT44(local_c0.super_AssertData.m_decomp.field_0._4_4_,
                                           local_c0.super_AssertData.m_decomp.field_0._0_4_));
      }
      local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = local_e0.buf[0x17];
      local_c0.super_AssertData.m_decomp.field_0._0_4_ = local_e0._0_4_;
      local_c0.super_AssertData.m_decomp.field_0._4_4_ = local_e0._4_4_;
      local_c0.super_AssertData.m_decomp.field_0.data.size = local_e0.data.size;
      local_c0.super_AssertData.m_decomp.field_0.data.capacity = local_e0.data.capacity;
      uVar6 = local_e0._0_4_;
      uVar7 = local_e0._4_4_;
    }
    dVar2 = ResultBuilder::log(&local_c0,(double)CONCAT44(uVar7,uVar6));
    if (extraout_AL != '\0') {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)(SUB84(dVar2,0));
      return (bool)uVar3;
    }
    if (local_c0.super_AssertData.m_failed == true) {
      bVar4 = checkIfShouldThrow(at);
      if (bVar4) {
        throwException();
      }
    }
  }
  if ((local_c0.super_AssertData.m_exception_string.content.string.field_0.buf[0x17] < '\0') &&
     (local_c0.super_AssertData.m_exception_string.content.string.field_0.data.ptr != (char *)0x0))
  {
    operator_delete__(local_c0.super_AssertData.m_exception_string.content.string.field_0.data.ptr);
  }
  if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT44(local_c0.super_AssertData.m_decomp.field_0._4_4_,
                       local_c0.super_AssertData.m_decomp.field_0._0_4_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT44(local_c0.super_AssertData.m_decomp.field_0._4_4_,
                                       local_c0.super_AssertData.m_decomp.field_0._0_4_));
  }
  if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     (local_c0.super_AssertData.m_exception.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_c0.super_AssertData.m_exception.field_0.data.ptr);
  }
LAB_00137778:
  return iVar5 == 0;
}

Assistant:

DOCTEST_NOINLINE bool binary_assert(assertType::Enum at, const char* file, int line,
                                        const char* expr, const DOCTEST_REF_WRAP(L) lhs,
                                        const DOCTEST_REF_WRAP(R) rhs) {
        bool failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(stringifyBinaryExpr(lhs, ", ", rhs));
        DOCTEST_ASSERT_IN_TESTS(stringifyBinaryExpr(lhs, ", ", rhs));
        return !failed;
    }